

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForOneof
          (Generator *this,OneofDescriptor *oneof)

{
  bool bVar1;
  OneofOptions *this_00;
  Descriptor *descriptor;
  string *value;
  SubstituteArg *in_stack_fffffffffffffd18;
  SubstituteArg local_2b0;
  SubstituteArg local_280;
  SubstituteArg local_250;
  SubstituteArg local_220;
  SubstituteArg local_1f0;
  SubstituteArg local_1c0;
  SubstituteArg local_190;
  SubstituteArg local_160;
  SubstituteArg local_130;
  string local_100;
  SubstituteArg local_e0;
  undefined1 local_b0 [8];
  string oneof_name;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string oneof_options;
  OneofDescriptor *oneof_local;
  Generator *this_local;
  
  oneof_options.field_2._8_8_ = oneof;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"OneofOptions",&local_59);
  this_00 = OneofDescriptor::options((OneofDescriptor *)oneof_options.field_2._8_8_);
  MessageLite::SerializeAsString_abi_cxx11_
            ((string *)((long)&oneof_name.field_2 + 8),(MessageLite *)this_00);
  OptionsValue((string *)local_38,this,&local_58,(string *)((long)&oneof_name.field_2 + 8));
  std::__cxx11::string::~string((string *)(oneof_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"None");
  if (bVar1) {
    descriptor = OneofDescriptor::containing_type((OneofDescriptor *)oneof_options.field_2._8_8_);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_100,this,descriptor);
    strings::internal::SubstituteArg::SubstituteArg(&local_e0,&local_100);
    strings::internal::SubstituteArg::SubstituteArg(&local_130,"oneofs_by_name");
    value = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)oneof_options.field_2._8_8_);
    strings::internal::SubstituteArg::SubstituteArg(&local_160,value);
    strings::internal::SubstituteArg::SubstituteArg(&local_190);
    strings::internal::SubstituteArg::SubstituteArg(&local_1c0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1f0);
    strings::internal::SubstituteArg::SubstituteArg(&local_220);
    strings::internal::SubstituteArg::SubstituteArg(&local_250);
    strings::internal::SubstituteArg::SubstituteArg(&local_280);
    strings::internal::SubstituteArg::SubstituteArg(&local_2b0);
    strings::Substitute_abi_cxx11_
              ((string *)local_b0,(strings *)"$0.$1[\'$2\']",(char *)&local_e0,&local_130,&local_160
               ,&local_190,&local_1c0,&local_1f0,&local_220,&local_250,&local_280,&local_2b0,
               in_stack_fffffffffffffd18);
    std::__cxx11::string::~string((string *)&local_100);
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              ((string *)local_b0,(string *)local_38,this->printer_);
    std::__cxx11::string::~string((string *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Generator::FixOptionsForOneof(const OneofDescriptor& oneof) const {
  string oneof_options = OptionsValue(
      "OneofOptions", oneof.options().SerializeAsString());
  if (oneof_options != "None") {
    string oneof_name = strings::Substitute(
        "$0.$1['$2']",
        ModuleLevelDescriptorName(*oneof.containing_type()),
        "oneofs_by_name", oneof.name());
    PrintDescriptorOptionsFixingCode(oneof_name, oneof_options, printer_);
  }
}